

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseJacocoCoverage::XMLParser::PackagePathFound(XMLParser *this,string *fileName,string *baseDir)

{
  cmCTest *this_00;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar2;
  ostream *poVar3;
  string local_298 [32];
  undefined1 local_278 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_100 [8];
  string dir;
  string *f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  Glob gl;
  undefined1 local_48 [8];
  string packageGlob;
  string *baseDir_local;
  string *fileName_local;
  XMLParser *this_local;
  
  packageGlob.field_2._8_8_ = baseDir;
  std::__cxx11::string::string((string *)local_48,(string *)baseDir);
  std::__cxx11::string::operator+=((string *)local_48,"/");
  std::__cxx11::string::operator+=((string *)local_48,(string *)fileName);
  cmsys::Glob::Glob((Glob *)&files);
  cmsys::Glob::RecurseOn((Glob *)&files);
  cmsys::Glob::RecurseThroughSymlinksOn((Glob *)&files);
  cmsys::Glob::FindFiles((Glob *)&files,(string *)local_48,(GlobMessages *)0x0);
  this_01 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&files);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_01);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&f), bVar1) {
      dir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      cmsys::SystemTools::GetParentDirectory((string *)local_100,(string *)dir.field_2._8_8_);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::StringEndsWith((string *)local_100,pcVar2);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        poVar3 = std::operator<<((ostream *)local_278,"Found package directory for ");
        poVar3 = std::operator<<(poVar3,(string *)fileName);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,(string *)local_100);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_00 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x7d,pcVar2,(bool)(this->Coverage->Quiet & 1));
        std::__cxx11::string::~string(local_298);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::__cxx11::string::operator=((string *)&this->PackagePath,(string *)local_100);
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_100);
      if (bVar1) goto LAB_001b1dfc;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 0;
  }
LAB_001b1dfc:
  cmsys::Glob::~Glob((Glob *)&files);
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool PackagePathFound(std::string const& fileName,
                                std::string const& baseDir)
  {
    // Search for the file in the baseDir and its subdirectories.
    std::string packageGlob = baseDir;
    packageGlob += "/";
    packageGlob += fileName;
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOn();
    gl.FindFiles(packageGlob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      return false;
    }

    // Check if any of the locations found match our package.
    for (std::string const& f : files) {
      std::string dir = cmsys::SystemTools::GetParentDirectory(f);
      if (cmsys::SystemTools::StringEndsWith(dir, this->PackageName.c_str())) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Found package directory for " << fileName << ": "
                                                          << dir << std::endl,
                           this->Coverage.Quiet);
        this->PackagePath = dir;
        return true;
      }
    }
    return false;
  }